

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O1

QPoint QtGuiTest::toNativePixels(QPoint *value,QWindow *window)

{
  QPoint QVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QPoint local_70;
  QPoint local_68;
  QWindow local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    QVar1 = local_70;
    QVar2.m_data = (storage_type *)0x1b;
    QVar2.m_size = (qsizetype)&local_60.super_QSurface;
    QString::fromUtf8(QVar2);
    QTextStream::operator<<((QTextStream *)QVar1,(QString *)&local_60.super_QSurface);
    if ((QArrayData *)local_60.super_QSurface._vptr_QSurface != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_60.super_QSurface._vptr_QSurface)->_q_value).
      super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_60.super_QSurface._vptr_QSurface)->_q_value).
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_60.super_QSurface._vptr_QSurface)->_q_value).
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_60.super_QSurface._vptr_QSurface,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_70 + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70,' ');
    }
    local_68 = local_70;
    *(int *)((long)local_70 + 0x28) = *(int *)((long)local_70 + 0x28) + 1;
    ::operator<<((QDebug *)&local_60,&local_68);
    ::operator<<((QDebug)&local_60.field_0x8,&local_60);
    QDebug::~QDebug((QDebug *)&local_60.field_0x8);
    QDebug::~QDebug((QDebug *)&local_60);
    QDebug::~QDebug((QDebug *)&local_68);
    QDebug::~QDebug((QDebug *)&local_70);
  }
  QVar1 = QHighDpi::toNativePixels<QPoint,QWindow>(value,window);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QtGuiTest::toNativePixels(const QPoint &value, const QWindow *window)
{
    Q_ASSERT_X(window,
               Q_FUNC_INFO,
               "called with nullptr");

    deb << "Calculating native pixels: " << value << window;
    return QHighDpi::toNativePixels<QPoint, QWindow>(value, window);
}